

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

void * parse_logic(Parser *parser)

{
  Token *op;
  void *left;
  void *right;
  BinaryExpr *pBVar1;
  
  left = parse_or(parser);
  op = parser->token;
  if ((op->kind & 0xfffffffe) == OR2) {
    move(parser);
    right = parse_or(parser);
    pBVar1 = new_binary_expr(left,op,right);
    return pBVar1;
  }
  return left;
}

Assistant:

void *parse_logic(Parser *parser) {
    void *left = parse_or(parser);
    Token *tok = token(parser);
    switch (token(parser)->kind) {
        case AND2:
        case OR2:
            move(parser);
            return new_binary_expr(left, tok, parse_or(parser));
        default:
            return left;
    }
}